

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntUniqify(Vec_Int_t *p)

{
  int *piVar1;
  int in_EAX;
  long lVar2;
  long lVar3;
  
  if (1 < p->nSize) {
    Vec_IntSort(p,0);
    in_EAX = 1;
    for (lVar2 = 1; lVar2 < p->nSize; lVar2 = lVar2 + 1) {
      piVar1 = p->pArray;
      if (piVar1[lVar2] != piVar1[lVar2 + -1]) {
        lVar3 = (long)in_EAX;
        in_EAX = in_EAX + 1;
        piVar1[lVar3] = piVar1[lVar2];
      }
    }
    p->nSize = in_EAX;
  }
  return in_EAX;
}

Assistant:

static inline int Vec_IntUniqify( Vec_Int_t * p )
{
    int i, k, RetValue;
    if ( p->nSize < 2 )
        return 0;
    Vec_IntSort( p, 0 );
    for ( i = k = 1; i < p->nSize; i++ )
        if ( p->pArray[i] != p->pArray[i-1] )
            p->pArray[k++] = p->pArray[i];
    RetValue = p->nSize - k;
    p->nSize = k;
    return RetValue;
}